

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::ObjectIntersectorK<4,_false>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float *pfVar1;
  size_t sVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  uint uVar9;
  undefined4 uVar10;
  NodeRef nodeRef;
  ulong uVar11;
  RTCIntersectFunctionN p_Var12;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar13;
  NodeRef *pNVar14;
  NodeRef *pNVar15;
  ulong uVar16;
  size_t sVar17;
  size_t sVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  vint4 ai_2;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  vint4 ai;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  vint4 ai_1;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  vint4 ai_3;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  vint4 bi;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  vint4 bi_1;
  undefined1 auVar79 [16];
  vint4 bi_3;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  vint4 bi_2;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 in_ZMM8 [64];
  undefined1 in_ZMM9 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  float fVar87;
  float fVar90;
  undefined1 auVar89 [64];
  float fVar91;
  float fVar94;
  undefined1 auVar93 [64];
  float fVar95;
  float fVar98;
  undefined1 auVar97 [64];
  undefined1 auVar99 [64];
  vint4 bi_8;
  RTCIntersectFunctionNArguments local_17d0;
  Geometry *local_17a0;
  undefined8 local_1798;
  RTCIntersectArguments *local_1790;
  undefined1 local_1788 [16];
  undefined1 local_1778 [16];
  undefined1 local_1768 [16];
  undefined1 local_1758 [16];
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  undefined1 local_1728 [16];
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  float local_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  vint<4> mask;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar88 [16];
  undefined1 auVar92 [16];
  undefined1 auVar96 [16];
  
  stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar26 = vpcmpeqd_avx(in_ZMM8._0_16_,in_ZMM8._0_16_);
      auVar23 = vpcmpeqd_avx(auVar26,(undefined1  [16])valid_i->field_0);
      uVar9 = vmovmskps_avx(auVar23);
      if (uVar9 != 0) {
        stack_node._1472_16_ = (undefined1  [16])valid_i->field_0;
        stack_node[0xa4].ptr = (size_t)This->ptr;
        stack_node[0xa5].ptr = (size_t)(uVar9 & 0xff);
        auVar65 = *(undefined1 (*) [16])ray;
        auVar85 = ZEXT1664(auVar65);
        auVar8 = *(undefined1 (*) [16])(ray + 0x10);
        auVar31 = ZEXT1664(auVar8);
        auVar30 = *(undefined1 (*) [16])(ray + 0x20);
        auVar86 = ZEXT1664(auVar30);
        auVar55 = *(undefined1 (*) [16])(ray + 0x40);
        auVar61._8_4_ = 0x7fffffff;
        auVar61._0_8_ = 0x7fffffff7fffffff;
        auVar61._12_4_ = 0x7fffffff;
        auVar43 = vandps_avx(auVar55,auVar61);
        auVar75._8_4_ = 0x219392ef;
        auVar75._0_8_ = 0x219392ef219392ef;
        auVar75._12_4_ = 0x219392ef;
        auVar43 = vcmpps_avx(auVar43,auVar75,1);
        auVar54 = vblendvps_avx(auVar55,auVar75,auVar43);
        auVar43 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar61);
        auVar43 = vcmpps_avx(auVar43,auVar75,1);
        auVar62 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar75,auVar43);
        auVar43 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar61);
        auVar43 = vcmpps_avx(auVar43,auVar75,1);
        auVar43 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar75,auVar43);
        auVar61 = vrcpps_avx(auVar54);
        fVar4 = auVar61._0_4_;
        auVar70._0_4_ = auVar54._0_4_ * fVar4;
        fVar5 = auVar61._4_4_;
        auVar70._4_4_ = auVar54._4_4_ * fVar5;
        fVar6 = auVar61._8_4_;
        auVar70._8_4_ = auVar54._8_4_ * fVar6;
        fVar7 = auVar61._12_4_;
        auVar70._12_4_ = auVar54._12_4_ * fVar7;
        auVar81._8_4_ = 0x3f800000;
        auVar81._0_8_ = &DAT_3f8000003f800000;
        auVar81._12_4_ = 0x3f800000;
        auVar54 = vsubps_avx(auVar81,auVar70);
        fVar87 = fVar4 + fVar4 * auVar54._0_4_;
        fVar90 = fVar5 + fVar5 * auVar54._4_4_;
        auVar88._0_8_ = CONCAT44(fVar90,fVar87);
        auVar88._8_4_ = fVar6 + fVar6 * auVar54._8_4_;
        auVar88._12_4_ = fVar7 + fVar7 * auVar54._12_4_;
        auVar89 = ZEXT1664(auVar88);
        auVar54 = vrcpps_avx(auVar62);
        fVar4 = auVar54._0_4_;
        auVar76._0_4_ = auVar62._0_4_ * fVar4;
        fVar5 = auVar54._4_4_;
        auVar76._4_4_ = auVar62._4_4_ * fVar5;
        fVar6 = auVar54._8_4_;
        auVar76._8_4_ = auVar62._8_4_ * fVar6;
        fVar7 = auVar54._12_4_;
        auVar76._12_4_ = auVar62._12_4_ * fVar7;
        auVar54 = vsubps_avx(auVar81,auVar76);
        fVar91 = fVar4 + fVar4 * auVar54._0_4_;
        fVar94 = fVar5 + fVar5 * auVar54._4_4_;
        auVar92._0_8_ = CONCAT44(fVar94,fVar91);
        auVar92._8_4_ = fVar6 + fVar6 * auVar54._8_4_;
        auVar92._12_4_ = fVar7 + fVar7 * auVar54._12_4_;
        auVar93 = ZEXT1664(auVar92);
        auVar54 = vrcpps_avx(auVar43);
        fVar4 = auVar54._0_4_;
        auVar62._0_4_ = auVar43._0_4_ * fVar4;
        fVar5 = auVar54._4_4_;
        auVar62._4_4_ = auVar43._4_4_ * fVar5;
        fVar6 = auVar54._8_4_;
        auVar62._8_4_ = auVar43._8_4_ * fVar6;
        fVar7 = auVar54._12_4_;
        auVar62._12_4_ = auVar43._12_4_ * fVar7;
        auVar43 = vsubps_avx(auVar81,auVar62);
        fVar95 = fVar4 + fVar4 * auVar43._0_4_;
        fVar98 = fVar5 + fVar5 * auVar43._4_4_;
        auVar96._0_8_ = CONCAT44(fVar98,fVar95);
        auVar96._8_4_ = fVar6 + fVar6 * auVar43._8_4_;
        auVar96._12_4_ = fVar7 + fVar7 * auVar43._12_4_;
        auVar97 = ZEXT1664(auVar96);
        auVar54 = ZEXT816(0) << 0x20;
        auVar43 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar54);
        stack_node[0xbc].ptr = auVar43._0_8_;
        stack_node[0xbd].ptr = auVar43._8_8_;
        stack_node[0xa3].ptr = (size_t)(ray + 0x80);
        auVar43 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar54);
        stack_node[0xba].ptr = auVar43._0_8_;
        stack_node[0xbb].ptr = auVar43._8_8_;
        auVar84 = ZEXT1664(auVar26 ^ auVar23);
        auVar55 = vcmpps_avx(auVar55,auVar54,1);
        auVar43._8_4_ = 1;
        auVar43._0_8_ = 0x100000001;
        auVar43._12_4_ = 1;
        auVar55 = vandps_avx(auVar55,auVar43);
        auVar43 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar54,1);
        auVar63._8_4_ = 2;
        auVar63._0_8_ = 0x200000002;
        auVar63._12_4_ = 2;
        auVar43 = vandps_avx(auVar43,auVar63);
        auVar43 = vorps_avx(auVar43,auVar55);
        auVar55 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar54,1);
        auVar54._8_4_ = 4;
        auVar54._0_8_ = 0x400000004;
        auVar54._12_4_ = 4;
        auVar55 = vandps_avx(auVar55,auVar54);
        auVar26 = vpor_avx(auVar26 ^ auVar23,auVar55);
        auVar26 = vpor_avx(auVar26,auVar43);
        stack_node[0xac].ptr = auVar26._0_8_;
        stack_node[0xad].ptr = auVar26._8_8_;
        stack_node[0xca].ptr = mm_lookupmask_ps._0_8_;
        stack_node[0xcb].ptr = mm_lookupmask_ps._8_8_;
        stack_node[200].ptr = auVar65._0_8_;
        stack_node[0xc9].ptr = auVar65._8_8_;
        stack_node[0xc6].ptr = auVar8._0_8_;
        stack_node[199].ptr = auVar8._8_8_;
        stack_node[0xc4].ptr = auVar30._0_8_;
        stack_node[0xc5].ptr = auVar30._8_8_;
        stack_node[0xc2].ptr = auVar88._0_8_;
        stack_node[0xc3].ptr = auVar88._8_8_;
        stack_node[0xc0].ptr = auVar92._0_8_;
        stack_node[0xc1].ptr = auVar92._8_8_;
        stack_node[0xbe].ptr = auVar96._0_8_;
        stack_node[0xbf].ptr = auVar96._8_8_;
        stack_node[0xa6].ptr = (size_t)ray;
        stack_node[0xa7].ptr = (size_t)context;
        do {
          lVar3 = 0;
          if (stack_node[0xa5].ptr != 0) {
            for (; (stack_node[0xa5].ptr >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
            }
          }
          uVar10 = *(undefined4 *)((long)&stack_node[0xac].ptr + lVar3 * 4);
          auVar26._4_4_ = uVar10;
          auVar26._0_4_ = uVar10;
          auVar26._8_4_ = uVar10;
          auVar26._12_4_ = uVar10;
          stack_node._1248_16_ = vpcmpeqd_avx(auVar26,stack_node._1376_16_);
          uVar10 = vmovmskps_avx(stack_node._1248_16_);
          uVar11 = CONCAT44((int)((ulong)lVar3 >> 0x20),uVar10);
          auVar64._8_4_ = 0x7f800000;
          auVar64._0_8_ = 0x7f8000007f800000;
          auVar64._12_4_ = 0x7f800000;
          auVar26 = vblendvps_avx(auVar64,auVar89._0_16_,stack_node._1248_16_);
          stack_node[0xa5].ptr = ~uVar11 & stack_node[0xa5].ptr;
          auVar23 = vshufps_avx(auVar26,auVar26,0xb1);
          auVar26 = vminps_avx(auVar23,auVar26);
          auVar23 = vshufpd_avx(auVar26,auVar26,1);
          auVar23 = vminps_avx(auVar23,auVar26);
          auVar26 = vblendvps_avx(auVar64,auVar93._0_16_,stack_node._1248_16_);
          auVar65 = vshufps_avx(auVar26,auVar26,0xb1);
          auVar26 = vminps_avx(auVar65,auVar26);
          auVar65 = vshufpd_avx(auVar26,auVar26,1);
          auVar26 = vminps_avx(auVar65,auVar26);
          auVar23 = vinsertps_avx(auVar23,auVar26,0x1c);
          auVar26 = vblendvps_avx(auVar64,auVar97._0_16_,stack_node._1248_16_);
          auVar65 = vshufps_avx(auVar26,auVar26,0xb1);
          auVar26 = vminps_avx(auVar65,auVar26);
          auVar65 = vshufpd_avx(auVar26,auVar26,1);
          auVar65 = vminps_avx(auVar65,auVar26);
          auVar83._8_4_ = 0xff800000;
          auVar83._0_8_ = 0xff800000ff800000;
          auVar83._12_4_ = 0xff800000;
          auVar26 = vblendvps_avx(auVar83,auVar89._0_16_,stack_node._1248_16_);
          auVar55 = vinsertps_avx(auVar23,auVar65,0x20);
          auVar23 = vshufps_avx(auVar26,auVar26,0xb1);
          auVar26 = vmaxps_avx(auVar23,auVar26);
          auVar23 = vshufpd_avx(auVar26,auVar26,1);
          auVar23 = vmaxps_avx(auVar23,auVar26);
          auVar26 = vblendvps_avx(auVar83,auVar93._0_16_,stack_node._1248_16_);
          auVar65 = vshufps_avx(auVar26,auVar26,0xb1);
          auVar26 = vmaxps_avx(auVar65,auVar26);
          auVar65 = vshufpd_avx(auVar26,auVar26,1);
          auVar26 = vmaxps_avx(auVar65,auVar26);
          auVar23 = vinsertps_avx(auVar23,auVar26,0x1c);
          auVar26 = vblendvps_avx(auVar83,auVar97._0_16_,stack_node._1248_16_);
          auVar65 = vshufps_avx(auVar26,auVar26,0xb1);
          auVar26 = vmaxps_avx(auVar65,auVar26);
          auVar65 = vshufpd_avx(auVar26,auVar26,1);
          auVar26 = vmaxps_avx(auVar65,auVar26);
          auVar43 = vinsertps_avx(auVar23,auVar26,0x20);
          auVar30 = vcmpps_avx(auVar55,(undefined1  [16])0x0,5);
          auVar26 = vblendvps_avx(auVar43,auVar55,auVar30);
          auVar23 = vmovshdup_avx(auVar26);
          stack_node[0xab].ptr = (ulong)(auVar23._0_4_ < 0.0) << 4 | 0x20;
          auVar23 = vshufpd_avx(auVar26,auVar26,1);
          stack_node[0xec].ptr = *(size_t *)(stack_node[0xa4].ptr + 0x70);
          stack_node[0xed].ptr = uVar11;
          uVar19 = (ulong)(auVar23._0_4_ < 0.0) << 4 | 0x40;
          stack_node[0xaa].ptr = stack_node[0xab].ptr ^ 0x10;
          auVar23 = vblendvps_avx(auVar64,auVar85._0_16_,stack_node._1248_16_);
          auVar65 = vshufps_avx(auVar23,auVar23,0xb1);
          auVar23 = vminps_avx(auVar65,auVar23);
          auVar65 = vshufpd_avx(auVar23,auVar23,1);
          auVar65 = vminps_avx(auVar65,auVar23);
          auVar23 = vblendvps_avx(auVar64,auVar31._0_16_,stack_node._1248_16_);
          auVar8 = vshufps_avx(auVar23,auVar23,0xb1);
          auVar23 = vminps_avx(auVar8,auVar23);
          auVar8 = vshufpd_avx(auVar23,auVar23,1);
          auVar23 = vminps_avx(auVar8,auVar23);
          auVar65 = vinsertps_avx(auVar65,auVar23,0x1c);
          auVar23 = vblendvps_avx(auVar64,auVar86._0_16_,stack_node._1248_16_);
          auVar8 = vshufps_avx(auVar23,auVar23,0xb1);
          auVar23 = vminps_avx(auVar8,auVar23);
          auVar8 = vshufpd_avx(auVar23,auVar23,1);
          auVar23 = vminps_avx(auVar8,auVar23);
          auVar65 = vinsertps_avx(auVar65,auVar23,0x20);
          auVar23 = vblendvps_avx(auVar83,auVar85._0_16_,stack_node._1248_16_);
          auVar8 = vshufps_avx(auVar23,auVar23,0xb1);
          auVar23 = vmaxps_avx(auVar8,auVar23);
          auVar8 = vshufpd_avx(auVar23,auVar23,1);
          auVar8 = vmaxps_avx(auVar8,auVar23);
          auVar23 = vblendvps_avx(auVar83,auVar31._0_16_,stack_node._1248_16_);
          auVar54 = vshufps_avx(auVar23,auVar23,0xb1);
          auVar23 = vmaxps_avx(auVar54,auVar23);
          auVar54 = vshufpd_avx(auVar23,auVar23,1);
          auVar23 = vmaxps_avx(auVar54,auVar23);
          auVar8 = vinsertps_avx(auVar8,auVar23,0x1c);
          auVar23 = vblendvps_avx(auVar83,auVar86._0_16_,stack_node._1248_16_);
          auVar54 = vshufps_avx(auVar23,auVar23,0xb1);
          auVar23 = vmaxps_avx(auVar54,auVar23);
          auVar54 = vshufpd_avx(auVar23,auVar23,1);
          auVar23 = vmaxps_avx(auVar54,auVar23);
          auVar8 = vinsertps_avx(auVar8,auVar23,0x20);
          auVar23 = vblendvps_avx(auVar8,auVar65,auVar30);
          auVar65 = vblendvps_avx(auVar65,auVar8,auVar30);
          stack_node._1280_16_ = vblendvps_avx(auVar83,stack_node._1488_16_,stack_node._1248_16_);
          auVar8 = vshufps_avx(stack_node._1280_16_,stack_node._1280_16_,0xb1);
          auVar54 = vmaxps_avx(auVar8,stack_node._1280_16_);
          auVar8 = vblendvps_avx(auVar64,stack_node._1504_16_,stack_node._1248_16_);
          auVar62 = vshufps_avx(auVar8,auVar8,0xb1);
          stack_node[0xe8].ptr = auVar8._0_8_;
          stack_node[0xe9].ptr = auVar8._8_8_;
          auVar62 = vminps_avx(auVar62,auVar8);
          auVar30 = vblendvps_avx(auVar55,auVar43,auVar30);
          auVar55._0_4_ = auVar65._0_4_ * auVar26._0_4_;
          auVar55._4_4_ = auVar65._4_4_ * auVar26._4_4_;
          auVar55._8_4_ = auVar65._8_4_ * auVar26._8_4_;
          auVar55._12_4_ = auVar65._12_4_ * auVar26._12_4_;
          auVar84 = ZEXT1664(auVar84._0_16_);
          auVar65 = vpcmpeqd_avx(auVar8,auVar8);
          auVar32 = ZEXT1664(auVar65);
          auVar65._0_4_ = auVar23._0_4_ * auVar30._0_4_;
          auVar65._4_4_ = auVar23._4_4_ * auVar30._4_4_;
          auVar65._8_4_ = auVar23._8_4_ * auVar30._8_4_;
          auVar65._12_4_ = auVar23._12_4_ * auVar30._12_4_;
          uVar20 = (ulong)(auVar26._0_4_ < 0.0) * 0x10;
          stack_node._1264_16_ = vshufps_avx(auVar26,auVar26,0);
          auVar23 = vshufps_avx(auVar55,auVar55,0);
          stack_node[0xe6].ptr = auVar23._0_8_;
          stack_node[0xe7].ptr = auVar23._8_8_;
          auVar23 = vshufps_avx(auVar26,auVar26,0x55);
          stack_node[0xe4].ptr = auVar23._0_8_;
          stack_node[0xe5].ptr = auVar23._8_8_;
          auVar23 = vshufps_avx(auVar55,auVar55,0x55);
          stack_node[0xe2].ptr = auVar23._0_8_;
          stack_node[0xe3].ptr = auVar23._8_8_;
          auVar26 = vshufps_avx(auVar26,auVar26,0xaa);
          stack_node[0xe0].ptr = auVar26._0_8_;
          stack_node[0xe1].ptr = auVar26._8_8_;
          auVar26 = vshufps_avx(auVar55,auVar55,0xaa);
          stack_node[0xde].ptr = auVar26._0_8_;
          stack_node[0xdf].ptr = auVar26._8_8_;
          auVar26 = vshufps_avx(auVar30,auVar30,0);
          stack_node[0xdc].ptr = auVar26._0_8_;
          stack_node[0xdd].ptr = auVar26._8_8_;
          auVar26 = vshufps_avx(auVar65,auVar65,0);
          stack_node[0xda].ptr = auVar26._0_8_;
          stack_node[0xdb].ptr = auVar26._8_8_;
          auVar26 = vshufps_avx(auVar62,auVar62,0);
          auVar23 = vshufps_avx(auVar62,auVar62,0xaa);
          auVar26 = vminps_avx(auVar23,auVar26);
          stack_node[0xd8].ptr = auVar26._0_8_;
          stack_node[0xd9].ptr = auVar26._8_8_;
          auVar26 = vshufps_avx(auVar54,auVar54,0);
          auVar23 = vshufps_avx(auVar54,auVar54,0xaa);
          auVar26 = vmaxps_avx(auVar23,auVar26);
          stack_node[0xd6].ptr = auVar26._0_8_;
          stack_node[0xd7].ptr = auVar26._8_8_;
          auVar26 = vshufps_avx(auVar30,auVar30,0x55);
          stack_node[0xd4].ptr = auVar26._0_8_;
          stack_node[0xd5].ptr = auVar26._8_8_;
          auVar26 = vshufps_avx(auVar30,auVar30,0xaa);
          stack_node[0xd2].ptr = auVar26._0_8_;
          stack_node[0xd3].ptr = auVar26._8_8_;
          auVar26 = vshufps_avx(auVar65,auVar65,0x55);
          stack_node[0xd0].ptr = auVar26._0_8_;
          stack_node[0xd1].ptr = auVar26._8_8_;
          auVar26 = vshufps_avx(auVar65,auVar65,0xaa);
          auVar99 = ZEXT1664(auVar26);
          stack_node[0xce].ptr = auVar26._0_8_;
          stack_node[0xcf].ptr = auVar26._8_8_;
          pNVar15 = stack_node + 0xee;
          do {
            auVar26 = auVar99._0_16_;
            if (pNVar15 == stack_node + 0xec) break;
            pNVar14 = pNVar15 + -2;
            stack_node._1232_16_ = auVar84._0_16_;
            uVar10 = vmovmskps_avx(stack_node._1232_16_);
            uVar11 = ~CONCAT44((int)(uVar11 >> 0x20),uVar10) & pNVar15[-1].ptr;
            if (uVar11 != 0) {
              sVar18 = pNVar14->ptr;
LAB_0037c84c:
              auVar23 = auVar84._0_16_;
              if ((sVar18 & 8) == 0) goto code_r0x0037c856;
              if (uVar11 != 0) {
                stack_node[0xb5].ptr = (ulong)((uint)sVar18 & 0xf) - 8;
                auVar26 = auVar23;
                if ((Geometry *)stack_node[0xb5].ptr != (Geometry *)0x0) {
                  stack_node[0xcc].ptr._0_4_ = auVar32._0_4_ ^ auVar84._0_4_;
                  stack_node[0xcc].ptr._4_4_ = auVar32._4_4_ ^ auVar84._4_4_;
                  stack_node[0xcd].ptr._0_4_ = auVar32._8_4_ ^ auVar84._8_4_;
                  stack_node[0xcd].ptr._4_4_ = auVar32._12_4_ ^ auVar84._12_4_;
                  stack_node[0xa9].ptr = (size_t)(Geometry *)0x1;
                  stack_node[0xa8].ptr = stack_node[0xb5].ptr;
                  do {
                    auVar55 = auVar32._0_16_;
                    stack_node[0xb4].ptr._4_4_ =
                         *(uint *)(((sVar18 & 0xfffffffffffffff0) - 8) + stack_node[0xa9].ptr * 8);
                    stack_node[0xb5].ptr =
                         (size_t)(context->scene->geometries).items[stack_node[0xb4].ptr._4_4_].ptr;
                    uVar9 = ((Geometry *)stack_node[0xb5].ptr)->mask;
                    auVar30._4_4_ = uVar9;
                    auVar30._0_4_ = uVar9;
                    auVar30._8_4_ = uVar9;
                    auVar30._12_4_ = uVar9;
                    auVar26 = vandps_avx(auVar30,*(undefined1 (*) [16])(ray + 0x90));
                    auVar26 = vpcmpeqd_avx((undefined1  [16])0x0,auVar26);
                    auVar23 = stack_node._1632_16_ & ~auVar26;
                    auVar8._8_8_ = stack_node[0xcb].ptr;
                    auVar8._0_8_ = stack_node[0xca].ptr;
                    auVar65 = stack_node._1632_16_;
                    if ((((auVar23 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar23 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar23 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar23[0xf] < '\0') {
                      stack_node._1872_16_ = vandnps_avx(auVar26,stack_node._1632_16_);
                      stack_node[0xb1].ptr._0_4_ =
                           *(undefined4 *)
                            (((sVar18 & 0xfffffffffffffff0) - 4) + stack_node[0xa9].ptr * 8);
                      stack_node[0xaf].ptr = (size_t)(stack_node + 0xea);
                      stack_node[0xb0].ptr = (size_t)((Geometry *)stack_node[0xb5].ptr)->userPtr;
                      stack_node[0xb2].ptr = (size_t)context->user;
                      stack_node[0xb4].ptr._0_4_ = 4;
                      stack_node[0xb6].ptr = 0;
                      stack_node[0xb7].ptr = (size_t)context->args;
                      p_Var12 = ((RTCIntersectArguments *)stack_node[0xb7].ptr)->intersect;
                      if (p_Var12 == (RTCIntersectFunctionN)0x0) {
                        p_Var12 = (RTCIntersectFunctionN)
                                  (((Geometry *)(stack_node[0xb5].ptr + 0x60))->super_RefCount).
                                  refCounter.super___atomic_base<unsigned_long>._M_i;
                      }
                      stack_node[0x99].ptr = 0x37cb4f;
                      stack_node[0xb3].ptr = (size_t)ray;
                      stack_node[0xb5].ptr =
                           (*p_Var12)((RTCIntersectFunctionNArguments *)(stack_node + 0xaf));
                      auVar8 = vcmpps_avx(*(undefined1 (*) [16])(stack_node[0xa6].ptr + 0x80),
                                          (undefined1  [16])0x0,1);
                      auVar26 = vpcmpeqd_avx(auVar55,auVar55);
                      auVar32 = ZEXT1664(auVar26);
                      auVar85 = ZEXT1664(stack_node._1600_16_);
                      auVar31 = ZEXT1664(stack_node._1584_16_);
                      auVar86 = ZEXT1664(stack_node._1568_16_);
                      auVar89 = ZEXT1664(stack_node._1552_16_);
                      auVar93 = ZEXT1664(stack_node._1536_16_);
                      auVar97 = ZEXT1664(stack_node._1520_16_);
                      auVar84 = ZEXT1664(stack_node._1232_16_);
                      context = (RayQueryContext *)stack_node[0xa7];
                      ray = (RayK<4> *)stack_node[0xa6];
                      auVar65 = stack_node._1632_16_;
                    }
                    auVar26 = auVar84._0_16_;
                    stack_node._1632_16_ = vandnps_avx(auVar8,auVar65);
                    auVar65 = auVar65 & ~auVar8;
                  } while (((((auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            auVar65[0xf] < '\0') &&
                          (stack_node[0xb5].ptr =
                                (long)&(((Geometry *)stack_node[0xa9].ptr)->super_RefCount).
                                       _vptr_RefCount + 1,
                          bVar22 = stack_node[0xa9].ptr < stack_node[0xa8].ptr,
                          stack_node[0xa9].ptr = stack_node[0xb5].ptr, bVar22));
                  auVar23._0_4_ = auVar32._0_4_ ^ (uint)stack_node[0xcc].ptr;
                  auVar23._4_4_ = auVar32._4_4_ ^ stack_node[0xcc].ptr._4_4_;
                  auVar23._8_4_ = auVar32._8_4_ ^ (uint)stack_node[0xcd].ptr;
                  auVar23._12_4_ = auVar32._12_4_ ^ stack_node[0xcd].ptr._4_4_;
                }
                auVar23 = vorps_avx(auVar26,auVar23);
                auVar84 = ZEXT1664(auVar23);
                auVar26 = vandnps_avx(auVar23,stack_node._1248_16_);
                auVar99 = ZEXT1664(auVar26);
                auVar65 = stack_node._1248_16_ & ~auVar23;
                stack_node._1248_16_ = auVar26;
                if ((((auVar65 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar65 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar65 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar65[0xf]) {
                  uVar11 = CONCAT71((int7)(stack_node[0xb5].ptr >> 8),1);
                }
                else {
                  auVar49._8_4_ = 0xff800000;
                  auVar49._0_8_ = 0xff800000ff800000;
                  auVar49._12_4_ = 0xff800000;
                  stack_node._1280_16_ = vblendvps_avx(stack_node._1280_16_,auVar49,auVar23);
                  uVar11 = 0;
                }
                goto LAB_0037cc27;
              }
            }
LAB_0037cc25:
            uVar11 = 0;
LAB_0037cc27:
            auVar26 = auVar99._0_16_;
            pNVar15 = pNVar14;
          } while ((char)uVar11 == '\0');
        } while (stack_node[0xa5].ptr != 0);
        auVar26 = vpcmpeqd_avx(auVar26,auVar26);
        auVar26 = vpcmpeqd_avx(auVar26,stack_node._1472_16_);
        auVar26 = vpand_avx(auVar26,auVar84._0_16_);
        auVar50._8_4_ = 0xff800000;
        auVar50._0_8_ = 0xff800000ff800000;
        auVar50._12_4_ = 0xff800000;
        auVar26 = vmaskmovps_avx(auVar26,auVar50);
        *(undefined1 (*) [16])stack_node[0xa3].ptr = auVar26;
      }
      return;
    }
    auVar23 = vpcmpeqd_avx(in_ZMM9._0_16_,in_ZMM9._0_16_);
    auVar84 = ZEXT1664(auVar23);
    auVar65 = vpcmpeqd_avx(auVar23,(undefined1  [16])valid_i->field_0);
    auVar30 = ZEXT816(0) << 0x40;
    auVar85 = ZEXT1664(auVar30);
    auVar26 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar30,5);
    auVar8 = auVar65 & auVar26;
    if ((((auVar8 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar8 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar8[0xf] < '\0') {
      local_1788 = vandps_avx(auVar26,auVar65);
      auVar89 = ZEXT1664(*(undefined1 (*) [16])ray);
      auVar93 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x10));
      auVar97 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x20));
      auVar51._8_4_ = 0x7fffffff;
      auVar51._0_8_ = 0x7fffffff7fffffff;
      auVar51._12_4_ = 0x7fffffff;
      auVar26 = vandps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar51);
      auVar68._8_4_ = 0x219392ef;
      auVar68._0_8_ = 0x219392ef219392ef;
      auVar68._12_4_ = 0x219392ef;
      auVar26 = vcmpps_avx(auVar26,auVar68,1);
      auVar65 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar68,auVar26);
      auVar26 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar51);
      auVar26 = vcmpps_avx(auVar26,auVar68,1);
      auVar8 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar68,auVar26);
      auVar26 = vrcpps_avx(auVar65);
      local_1708 = auVar26._0_4_;
      auVar33._0_4_ = auVar65._0_4_ * local_1708;
      fStack_1704 = auVar26._4_4_;
      auVar33._4_4_ = auVar65._4_4_ * fStack_1704;
      fStack_1700 = auVar26._8_4_;
      auVar33._8_4_ = auVar65._8_4_ * fStack_1700;
      fStack_16fc = auVar26._12_4_;
      auVar33._12_4_ = auVar65._12_4_ * fStack_16fc;
      auVar82._8_4_ = 0x3f800000;
      auVar82._0_8_ = &DAT_3f8000003f800000;
      auVar82._12_4_ = 0x3f800000;
      auVar55 = vsubps_avx(auVar82,auVar33);
      auVar26 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar51);
      auVar26 = vcmpps_avx(auVar26,auVar68,1);
      auVar26 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar68,auVar26);
      auVar65 = vrcpps_avx(auVar8);
      local_1718 = auVar65._0_4_;
      auVar73._0_4_ = auVar8._0_4_ * local_1718;
      fStack_1714 = auVar65._4_4_;
      auVar73._4_4_ = auVar8._4_4_ * fStack_1714;
      fStack_1710 = auVar65._8_4_;
      auVar73._8_4_ = auVar8._8_4_ * fStack_1710;
      fStack_170c = auVar65._12_4_;
      auVar73._12_4_ = auVar8._12_4_ * fStack_170c;
      auVar43 = vsubps_avx(auVar82,auVar73);
      auVar65 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar30);
      auVar8 = vrcpps_avx(auVar26);
      local_16f8 = auVar8._0_4_;
      auVar52._0_4_ = auVar26._0_4_ * local_16f8;
      fStack_16f4 = auVar8._4_4_;
      auVar52._4_4_ = auVar26._4_4_ * fStack_16f4;
      fStack_16f0 = auVar8._8_4_;
      auVar52._8_4_ = auVar26._8_4_ * fStack_16f0;
      fStack_16ec = auVar8._12_4_;
      auVar52._12_4_ = auVar26._12_4_ * fStack_16ec;
      auVar26 = vsubps_avx(auVar82,auVar52);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar99 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      stack_near[1].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar65,local_1788);
      local_16f8 = local_16f8 + local_16f8 * auVar26._0_4_;
      fStack_16f4 = fStack_16f4 + fStack_16f4 * auVar26._4_4_;
      fStack_16f0 = fStack_16f0 + fStack_16f0 * auVar26._8_4_;
      fStack_16ec = fStack_16ec + fStack_16ec * auVar26._12_4_;
      auVar26 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar30);
      local_1708 = local_1708 + local_1708 * auVar55._0_4_;
      fStack_1704 = fStack_1704 + fStack_1704 * auVar55._4_4_;
      fStack_1700 = fStack_1700 + fStack_1700 * auVar55._8_4_;
      fStack_16fc = fStack_16fc + fStack_16fc * auVar55._12_4_;
      auVar34._8_4_ = 0xff800000;
      auVar34._0_8_ = 0xff800000ff800000;
      auVar34._12_4_ = 0xff800000;
      bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                     vblendvps_avx(auVar34,auVar26,local_1788);
      auVar31 = ZEXT1664(CONCAT412(local_1788._12_4_ ^ auVar23._12_4_,
                                   CONCAT48(local_1788._8_4_ ^ auVar23._8_4_,
                                            CONCAT44(local_1788._4_4_ ^ auVar23._4_4_,
                                                     local_1788._0_4_ ^ auVar23._0_4_))));
      auVar86 = ZEXT1664((undefined1  [16])stack_near[1].field_0);
      local_1718 = local_1718 + local_1718 * auVar43._0_4_;
      fStack_1714 = fStack_1714 + fStack_1714 * auVar43._4_4_;
      fStack_1710 = fStack_1710 + fStack_1710 * auVar43._8_4_;
      fStack_170c = fStack_170c + fStack_170c * auVar43._12_4_;
      pNVar15 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar13 = &stack_near[2].field_0;
      local_1738._8_8_ = mm_lookupmask_ps._8_8_;
      local_1738._0_8_ = mm_lookupmask_ps._0_8_;
      do {
        paVar13 = paVar13 + -1;
        pNVar14 = pNVar15 + -1;
        pNVar15 = pNVar15 + -1;
        bVar22 = true;
        if (pNVar14->ptr != 0xfffffffffffffff8) {
          auVar23 = auVar31._0_16_;
          auVar32 = ZEXT1664((undefined1  [16])*paVar13);
          auVar26 = vcmpps_avx((undefined1  [16])*paVar13,(undefined1  [16])bi_8.field_0,1);
          sVar18 = pNVar14->ptr;
          if ((((auVar26 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar26 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar26 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar26[0xf] < '\0') {
LAB_00333075:
            local_1748 = auVar89._0_16_;
            local_1758 = auVar93._0_16_;
            local_1768 = auVar97._0_16_;
            local_1778 = auVar86._0_16_;
            if ((sVar18 & 8) == 0) goto code_r0x0033307f;
            if (sVar18 == 0xfffffffffffffff8) goto LAB_003331ae;
            auVar26 = vcmpps_avx((undefined1  [16])bi_8.field_0,auVar32._0_16_,6);
            if ((((auVar26 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar26 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar26 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar26[0xf] < '\0') {
              uVar11 = (ulong)((uint)sVar18 & 0xf);
              auVar25 = auVar23;
              if (uVar11 != 8) {
                local_1728._0_4_ = auVar84._0_4_ ^ auVar31._0_4_;
                local_1728._4_4_ = auVar84._4_4_ ^ auVar31._4_4_;
                local_1728._8_4_ = auVar84._8_4_ ^ auVar31._8_4_;
                local_1728._12_4_ = auVar84._12_4_ ^ auVar31._12_4_;
                uVar19 = 1;
                do {
                  auVar55 = auVar84._0_16_;
                  local_17d0.geomID = *(uint *)(((sVar18 & 0xfffffffffffffff0) - 8) + uVar19 * 8);
                  local_17a0 = (context->scene->geometries).items[local_17d0.geomID].ptr;
                  uVar9 = local_17a0->mask;
                  auVar24._4_4_ = uVar9;
                  auVar24._0_4_ = uVar9;
                  auVar24._8_4_ = uVar9;
                  auVar24._12_4_ = uVar9;
                  auVar26 = vandps_avx(auVar24,*(undefined1 (*) [16])(ray + 0x90));
                  auVar65 = vpcmpeqd_avx(auVar85._0_16_,auVar26);
                  auVar8 = local_1728 & ~auVar65;
                  auVar26 = local_1738;
                  auVar30 = local_1728;
                  if ((((auVar8 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar8 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar8[0xf] < '\0') {
                    mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                   vandnps_avx(auVar65,local_1728);
                    local_17d0.primID = *(uint *)(((sVar18 & 0xfffffffffffffff0) - 4) + uVar19 * 8);
                    local_17d0.valid = (int *)&mask;
                    local_17d0.geometryUserPtr = local_17a0->userPtr;
                    local_17d0.context = context->user;
                    local_17d0.N = 4;
                    local_1798 = 0;
                    local_1790 = context->args;
                    p_Var12 = local_1790->intersect;
                    if (p_Var12 == (RTCIntersectFunctionN)0x0) {
                      p_Var12 = (RTCIntersectFunctionN)
                                local_17a0[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i;
                    }
                    local_17d0.rayhit = (RTCRayHitN *)ray;
                    (*p_Var12)(&local_17d0);
                    auVar85 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar26 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x40,1);
                    auVar65 = vpcmpeqd_avx(auVar55,auVar55);
                    auVar84 = ZEXT1664(auVar65);
                    auVar89 = ZEXT1664(local_1748);
                    auVar93 = ZEXT1664(local_1758);
                    auVar97 = ZEXT1664(local_1768);
                    auVar99 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000))
                                      );
                    auVar86 = ZEXT1664(local_1778);
                    auVar30 = local_1728;
                  }
                  local_1728 = vandnps_avx(auVar26,auVar30);
                  auVar30 = auVar30 & ~auVar26;
                } while (((((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar30[0xf] < '\0') &&
                        (bVar22 = uVar19 < uVar11 - 8, uVar19 = uVar19 + 1, bVar22));
                auVar25._0_4_ = auVar84._0_4_ ^ local_1728._0_4_;
                auVar25._4_4_ = auVar84._4_4_ ^ local_1728._4_4_;
                auVar25._8_4_ = auVar84._8_4_ ^ local_1728._8_4_;
                auVar25._12_4_ = auVar84._12_4_ ^ local_1728._12_4_;
              }
              bVar22 = true;
              auVar26 = vorps_avx(auVar23,auVar25);
              auVar23 = auVar84._0_16_ & ~auVar26;
              auVar31 = ZEXT1664(auVar26);
              if ((((auVar23 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar23 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar23 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar23[0xf] < '\0') {
                auVar41._8_4_ = 0xff800000;
                auVar41._0_8_ = 0xff800000ff800000;
                auVar41._12_4_ = 0xff800000;
                bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                               vblendvps_avx((undefined1  [16])bi_8.field_0,auVar41,auVar26);
                bVar22 = false;
              }
              goto LAB_003331b3;
            }
          }
LAB_003331ab:
          bVar22 = false;
LAB_003331ae:
          auVar31 = ZEXT1664(auVar23);
        }
LAB_003331b3:
      } while (!bVar22);
      auVar26 = vandps_avx(auVar31._0_16_,local_1788);
      auVar42._8_4_ = 0xff800000;
      auVar42._0_8_ = 0xff800000ff800000;
      auVar42._12_4_ = 0xff800000;
      auVar26 = vmaskmovps_avx(auVar26,auVar42);
      *(undefined1 (*) [16])(ray + 0x80) = auVar26;
    }
  }
  return;
code_r0x0037c856:
  pfVar1 = (float *)(sVar18 + 0x20 + uVar20);
  auVar27._0_4_ = (float)stack_node[0x9e].ptr * *pfVar1;
  auVar27._4_4_ = stack_node[0x9e].ptr._4_4_ * pfVar1[1];
  auVar27._8_4_ = (float)stack_node[0x9f].ptr * pfVar1[2];
  auVar27._12_4_ = stack_node[0x9f].ptr._4_4_ * pfVar1[3];
  auVar26 = vsubps_avx(auVar27,stack_node._1840_16_);
  pfVar1 = (float *)(sVar18 + 0x20 + stack_node[0xab].ptr);
  auVar44._0_4_ = (float)stack_node[0xe4].ptr * *pfVar1;
  auVar44._4_4_ = stack_node[0xe4].ptr._4_4_ * pfVar1[1];
  auVar44._8_4_ = (float)stack_node[0xe5].ptr * pfVar1[2];
  auVar44._12_4_ = stack_node[0xe5].ptr._4_4_ * pfVar1[3];
  auVar23 = vsubps_avx(auVar44,stack_node._1808_16_);
  auVar26 = vpmaxsd_avx(auVar26,auVar23);
  pfVar1 = (float *)(sVar18 + 0x20 + uVar19);
  auVar45._0_4_ = (float)stack_node[0xe0].ptr * *pfVar1;
  auVar45._4_4_ = stack_node[0xe0].ptr._4_4_ * pfVar1[1];
  auVar45._8_4_ = (float)stack_node[0xe1].ptr * pfVar1[2];
  auVar45._12_4_ = stack_node[0xe1].ptr._4_4_ * pfVar1[3];
  auVar23 = vsubps_avx(auVar45,stack_node._1776_16_);
  auVar23 = vpmaxsd_avx(auVar23,stack_node._1728_16_);
  auVar26 = vpmaxsd_avx(auVar26,auVar23);
  pfVar1 = (float *)(sVar18 + 0x20 + (uVar20 ^ 0x10));
  auVar46._0_4_ = (float)stack_node[0xdc].ptr * *pfVar1;
  auVar46._4_4_ = stack_node[0xdc].ptr._4_4_ * pfVar1[1];
  auVar46._8_4_ = (float)stack_node[0xdd].ptr * pfVar1[2];
  auVar46._12_4_ = stack_node[0xdd].ptr._4_4_ * pfVar1[3];
  auVar23 = vsubps_avx(auVar46,stack_node._1744_16_);
  pfVar1 = (float *)(sVar18 + 0x20 + stack_node[0xaa].ptr);
  auVar56._0_4_ = (float)stack_node[0xd4].ptr * *pfVar1;
  auVar56._4_4_ = stack_node[0xd4].ptr._4_4_ * pfVar1[1];
  auVar56._8_4_ = (float)stack_node[0xd5].ptr * pfVar1[2];
  auVar56._12_4_ = stack_node[0xd5].ptr._4_4_ * pfVar1[3];
  auVar65 = vsubps_avx(auVar56,stack_node._1664_16_);
  auVar23 = vpminsd_avx(auVar23,auVar65);
  pfVar1 = (float *)(sVar18 + 0x20 + (uVar19 ^ 0x10));
  auVar57._0_4_ = (float)stack_node[0xd2].ptr * *pfVar1;
  auVar57._4_4_ = stack_node[0xd2].ptr._4_4_ * pfVar1[1];
  auVar57._8_4_ = (float)stack_node[0xd3].ptr * pfVar1[2];
  auVar57._12_4_ = stack_node[0xd3].ptr._4_4_ * pfVar1[3];
  auVar65 = vsubps_avx(auVar57,stack_node._1648_16_);
  auVar65 = vpminsd_avx(auVar65,stack_node._1712_16_);
  auVar23 = vpminsd_avx(auVar23,auVar65);
  auVar26 = vcmpps_avx(auVar26,auVar23,2);
  uVar9 = vmovmskps_avx(auVar26);
  if (uVar9 == 0) {
    bVar22 = false;
  }
  else {
    uVar16 = (ulong)(uVar9 & 0xff);
    uVar11 = 0;
    sVar17 = 8;
    do {
      lVar3 = 0;
      if (uVar16 != 0) {
        for (; (uVar16 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
        }
      }
      uVar10 = *(undefined4 *)(sVar18 + 0x20 + lVar3 * 4);
      auVar28._4_4_ = uVar10;
      auVar28._0_4_ = uVar10;
      auVar28._8_4_ = uVar10;
      auVar28._12_4_ = uVar10;
      auVar26 = vsubps_avx(auVar28,auVar85._0_16_);
      auVar29._0_4_ = auVar89._0_4_ * auVar26._0_4_;
      auVar29._4_4_ = auVar89._4_4_ * auVar26._4_4_;
      auVar29._8_4_ = auVar89._8_4_ * auVar26._8_4_;
      auVar29._12_4_ = auVar89._12_4_ * auVar26._12_4_;
      uVar10 = *(undefined4 *)(sVar18 + 0x40 + lVar3 * 4);
      auVar47._4_4_ = uVar10;
      auVar47._0_4_ = uVar10;
      auVar47._8_4_ = uVar10;
      auVar47._12_4_ = uVar10;
      auVar26 = vsubps_avx(auVar47,auVar31._0_16_);
      auVar48._0_4_ = auVar93._0_4_ * auVar26._0_4_;
      auVar48._4_4_ = auVar93._4_4_ * auVar26._4_4_;
      auVar48._8_4_ = auVar93._8_4_ * auVar26._8_4_;
      auVar48._12_4_ = auVar93._12_4_ * auVar26._12_4_;
      uVar10 = *(undefined4 *)(sVar18 + 0x60 + lVar3 * 4);
      auVar58._4_4_ = uVar10;
      auVar58._0_4_ = uVar10;
      auVar58._8_4_ = uVar10;
      auVar58._12_4_ = uVar10;
      auVar26 = vsubps_avx(auVar58,auVar86._0_16_);
      auVar59._0_4_ = auVar97._0_4_ * auVar26._0_4_;
      auVar59._4_4_ = auVar97._4_4_ * auVar26._4_4_;
      auVar59._8_4_ = auVar97._8_4_ * auVar26._8_4_;
      auVar59._12_4_ = auVar97._12_4_ * auVar26._12_4_;
      uVar10 = *(undefined4 *)(sVar18 + 0x30 + lVar3 * 4);
      auVar66._4_4_ = uVar10;
      auVar66._0_4_ = uVar10;
      auVar66._8_4_ = uVar10;
      auVar66._12_4_ = uVar10;
      auVar26 = vsubps_avx(auVar66,auVar85._0_16_);
      auVar67._0_4_ = auVar89._0_4_ * auVar26._0_4_;
      auVar67._4_4_ = auVar89._4_4_ * auVar26._4_4_;
      auVar67._8_4_ = auVar89._8_4_ * auVar26._8_4_;
      auVar67._12_4_ = auVar89._12_4_ * auVar26._12_4_;
      uVar10 = *(undefined4 *)(sVar18 + 0x50 + lVar3 * 4);
      auVar71._4_4_ = uVar10;
      auVar71._0_4_ = uVar10;
      auVar71._8_4_ = uVar10;
      auVar71._12_4_ = uVar10;
      auVar26 = vsubps_avx(auVar71,auVar31._0_16_);
      auVar72._0_4_ = auVar93._0_4_ * auVar26._0_4_;
      auVar72._4_4_ = auVar93._4_4_ * auVar26._4_4_;
      auVar72._8_4_ = auVar93._8_4_ * auVar26._8_4_;
      auVar72._12_4_ = auVar93._12_4_ * auVar26._12_4_;
      uVar10 = *(undefined4 *)(sVar18 + 0x70 + lVar3 * 4);
      auVar77._4_4_ = uVar10;
      auVar77._0_4_ = uVar10;
      auVar77._8_4_ = uVar10;
      auVar77._12_4_ = uVar10;
      auVar26 = vsubps_avx(auVar77,auVar86._0_16_);
      auVar78._0_4_ = auVar97._0_4_ * auVar26._0_4_;
      auVar78._4_4_ = auVar97._4_4_ * auVar26._4_4_;
      auVar78._8_4_ = auVar97._8_4_ * auVar26._8_4_;
      auVar78._12_4_ = auVar97._12_4_ * auVar26._12_4_;
      auVar26 = vpminsd_avx(auVar29,auVar67);
      auVar23 = vpminsd_avx(auVar48,auVar72);
      auVar26 = vpmaxsd_avx(auVar26,auVar23);
      auVar8 = vpminsd_avx(auVar59,auVar78);
      auVar23 = vpmaxsd_avx(auVar29,auVar67);
      auVar65 = vpmaxsd_avx(auVar48,auVar72);
      auVar30 = vpminsd_avx(auVar23,auVar65);
      auVar23 = vpmaxsd_avx(auVar59,auVar78);
      auVar65 = vpmaxsd_avx(auVar8,stack_node._1856_16_);
      auVar26 = vpmaxsd_avx(auVar26,auVar65);
      auVar23 = vpminsd_avx(auVar23,stack_node._1280_16_);
      auVar23 = vpminsd_avx(auVar30,auVar23);
      auVar26 = vcmpps_avx(auVar26,auVar23,2);
      uVar9 = vmovmskps_avx(auVar26);
      if (uVar9 != 0) {
        sVar2 = *(size_t *)(sVar18 + lVar3 * 8);
        if (sVar17 != 8) {
          pNVar14->ptr = sVar17;
          pNVar14[1].ptr = uVar11;
          pNVar14 = pNVar14 + 2;
        }
        uVar11 = (ulong)(uVar9 & 0xff);
        sVar17 = sVar2;
      }
      auVar84 = ZEXT1664(stack_node._1232_16_);
      uVar16 = uVar16 & uVar16 - 1;
    } while (uVar16 != 0);
    bVar22 = sVar17 != 8;
    sVar18 = sVar17;
  }
  auVar99 = ZEXT1664(auVar26);
  if (!bVar22) goto LAB_0037cc25;
  goto LAB_0037c84c;
code_r0x0033307f:
  auVar32 = ZEXT1664(auVar99._0_16_);
  uVar11 = 0;
  sVar17 = 8;
  do {
    sVar2 = *(size_t *)((sVar18 & 0xfffffffffffffff0) + uVar11 * 8);
    if (sVar2 != 8) {
      uVar10 = *(undefined4 *)(sVar18 + 0x20 + uVar11 * 4);
      auVar35._4_4_ = uVar10;
      auVar35._0_4_ = uVar10;
      auVar35._8_4_ = uVar10;
      auVar35._12_4_ = uVar10;
      auVar26 = vsubps_avx(auVar35,local_1748);
      auVar53._0_4_ = local_1708 * auVar26._0_4_;
      auVar53._4_4_ = fStack_1704 * auVar26._4_4_;
      auVar53._8_4_ = fStack_1700 * auVar26._8_4_;
      auVar53._12_4_ = fStack_16fc * auVar26._12_4_;
      uVar10 = *(undefined4 *)(sVar18 + 0x40 + uVar11 * 4);
      auVar36._4_4_ = uVar10;
      auVar36._0_4_ = uVar10;
      auVar36._8_4_ = uVar10;
      auVar36._12_4_ = uVar10;
      auVar26 = vsubps_avx(auVar36,local_1758);
      auVar60._0_4_ = local_16f8 * auVar26._0_4_;
      auVar60._4_4_ = fStack_16f4 * auVar26._4_4_;
      auVar60._8_4_ = fStack_16f0 * auVar26._8_4_;
      auVar60._12_4_ = fStack_16ec * auVar26._12_4_;
      uVar10 = *(undefined4 *)(sVar18 + 0x60 + uVar11 * 4);
      auVar37._4_4_ = uVar10;
      auVar37._0_4_ = uVar10;
      auVar37._8_4_ = uVar10;
      auVar37._12_4_ = uVar10;
      auVar26 = vsubps_avx(auVar37,local_1768);
      auVar69._0_4_ = local_1718 * auVar26._0_4_;
      auVar69._4_4_ = fStack_1714 * auVar26._4_4_;
      auVar69._8_4_ = fStack_1710 * auVar26._8_4_;
      auVar69._12_4_ = fStack_170c * auVar26._12_4_;
      uVar10 = *(undefined4 *)(sVar18 + 0x30 + uVar11 * 4);
      auVar38._4_4_ = uVar10;
      auVar38._0_4_ = uVar10;
      auVar38._8_4_ = uVar10;
      auVar38._12_4_ = uVar10;
      auVar26 = vsubps_avx(auVar38,local_1748);
      auVar74._0_4_ = local_1708 * auVar26._0_4_;
      auVar74._4_4_ = fStack_1704 * auVar26._4_4_;
      auVar74._8_4_ = fStack_1700 * auVar26._8_4_;
      auVar74._12_4_ = fStack_16fc * auVar26._12_4_;
      uVar10 = *(undefined4 *)(sVar18 + 0x50 + uVar11 * 4);
      auVar39._4_4_ = uVar10;
      auVar39._0_4_ = uVar10;
      auVar39._8_4_ = uVar10;
      auVar39._12_4_ = uVar10;
      auVar26 = vsubps_avx(auVar39,local_1758);
      auVar79._0_4_ = local_16f8 * auVar26._0_4_;
      auVar79._4_4_ = fStack_16f4 * auVar26._4_4_;
      auVar79._8_4_ = fStack_16f0 * auVar26._8_4_;
      auVar79._12_4_ = fStack_16ec * auVar26._12_4_;
      uVar10 = *(undefined4 *)(sVar18 + 0x70 + uVar11 * 4);
      auVar40._4_4_ = uVar10;
      auVar40._0_4_ = uVar10;
      auVar40._8_4_ = uVar10;
      auVar40._12_4_ = uVar10;
      auVar26 = vsubps_avx(auVar40,local_1768);
      auVar80._0_4_ = local_1718 * auVar26._0_4_;
      auVar80._4_4_ = fStack_1714 * auVar26._4_4_;
      auVar80._8_4_ = fStack_1710 * auVar26._8_4_;
      auVar80._12_4_ = fStack_170c * auVar26._12_4_;
      auVar26 = vpminsd_avx(auVar53,auVar74);
      auVar65 = vpminsd_avx(auVar60,auVar79);
      auVar26 = vpmaxsd_avx(auVar26,auVar65);
      auVar65 = vpminsd_avx(auVar69,auVar80);
      auVar65 = vpmaxsd_avx(auVar26,auVar65);
      auVar26 = vpmaxsd_avx(auVar53,auVar74);
      auVar8 = vpmaxsd_avx(auVar60,auVar79);
      auVar30 = vpminsd_avx(auVar26,auVar8);
      auVar26 = vpmaxsd_avx(auVar69,auVar80);
      auVar8 = vpmaxsd_avx(auVar65,local_1778);
      auVar26 = vpminsd_avx(auVar26,(undefined1  [16])bi_8.field_0);
      auVar26 = vpminsd_avx(auVar30,auVar26);
      auVar26 = vcmpps_avx(auVar8,auVar26,2);
      if ((((auVar26 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar26 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar26 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar26[0xf] < '\0'
         ) {
        auVar26 = vblendvps_avx(auVar99._0_16_,auVar65,auVar26);
        if (sVar17 != 8) {
          pNVar15->ptr = sVar17;
          pNVar15 = pNVar15 + 1;
          *paVar13 = auVar32._0_16_;
          paVar13 = paVar13 + 1;
        }
        auVar32 = ZEXT1664(auVar26);
        sVar17 = sVar2;
      }
    }
  } while ((sVar2 != 8) && (bVar21 = uVar11 < 3, uVar11 = uVar11 + 1, bVar21));
  sVar18 = sVar17;
  if (sVar17 == 8) goto LAB_003331ab;
  goto LAB_00333075;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }